

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_arg_test.cc
# Opt level: O0

void re2::REArgTestIntTest(void)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  LogMessage local_340;
  LogMessage local_1b0;
  byte local_2a;
  undefined1 local_29;
  bool success;
  char *pcStack_28;
  bool retval;
  char *p;
  Arg arg;
  int i;
  int r;
  
  for (arg.parser_._0_4_ = 0; (int)arg.parser_ < 0x19; arg.parser_._0_4_ = (int)arg.parser_ + 1) {
    RE2::Arg::Arg((Arg *)&p,(int *)((long)&arg.parser_ + 4));
    __s = *(char **)(kSuccessTable + (long)(int)arg.parser_ * 0x18);
    pcStack_28 = __s;
    sVar1 = strlen(__s);
    local_29 = RE2::Arg::Parse((Arg *)&p,__s,(int)sVar1);
    local_2a = kSuccessTable[(long)(int)arg.parser_ * 0x18 + 0x12] & 1;
    if (local_29 != local_2a) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x76);
      poVar2 = LogMessage::stream(&local_1b0);
      poVar2 = std::operator<<(poVar2,"Check failed: (retval) == (success)");
      poVar2 = std::operator<<(poVar2,"Parsing \'");
      poVar2 = std::operator<<(poVar2,pcStack_28);
      poVar2 = std::operator<<(poVar2,"\' for type int should return ");
      std::ostream::operator<<(poVar2,(bool)(local_2a & 1));
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    if (((local_2a & 1) != 0) &&
       (arg.parser_._4_4_ != (int)*(undefined8 *)(kSuccessTable + (long)(int)arg.parser_ * 0x18 + 8)
       )) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_340,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x76);
      poVar2 = LogMessage::stream(&local_340);
      std::operator<<(poVar2,"Check failed: (r) == ((int)kSuccessTable[i].value)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_340);
    }
  }
  return;
}

Assistant:

TEST(REArgTest, IntTest) {
  PARSE_FOR_TYPE(int, 2);
}

TEST(REArgTest, UInt32Test) {
  PARSE_FOR_TYPE(uint32, 3);
}

TEST(REArgTest, Iint64Test) {
  PARSE_FOR_TYPE(int64, 4);
}

TEST(REArgTest, Uint64Test) {
  PARSE_FOR_TYPE(uint64, 5);
}

}